

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O3

bool __thiscall dxil_spv::Converter::Impl::get_needs_temp_storage_copy(Impl *this,Value *value)

{
  ValueKind VVar1;
  Value *this_00;
  const_iterator cVar2;
  bool bVar3;
  Value *local_18;
  
  bVar3 = true;
  if (value != (Value *)0x0) {
    local_18 = value;
    this_00 = LLVMBC::Internal::resolve_proxy(value);
    VVar1 = LLVMBC::Value::get_value_kind(this_00);
    if (VVar1 == Alloca) {
      cVar2 = std::
              _Hashtable<const_LLVMBC::Value_*,_const_LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Value_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&(this->needs_temp_storage_copy)._M_h,&local_18);
      bVar3 = cVar2.super__Node_iterator_base<const_LLVMBC::Value_*,_false>._M_cur !=
              (__node_type *)0x0;
    }
  }
  return bVar3;
}

Assistant:

bool Converter::Impl::get_needs_temp_storage_copy(const llvm::Value *value) const
{
	// We always need a temp storage copy if this isn't
	// directly the result of an alloca instruction.
	if (!llvm::dyn_cast<llvm::AllocaInst>(value))
		return true;

	// We'll also need a temp storage copy if this
	// alloca is directly referenced by
	// a TraceRay AND a CallShader.
	return needs_temp_storage_copy.count(value) != 0;
}